

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexo.h
# Opt level: O2

void rx__int_assess_comparison
               (rx_context *context,rx__int x1,rx__int x2,rx__op op,char *expr1,char *expr2,
               char *file,int line,rx_severity severity,char *failure_fmt,...)

{
  rx_status rVar1;
  char *s;
  char *pcVar2;
  ulong uVar3;
  char *file_00;
  char *file_01;
  bool bVar4;
  char *in_stack_ffffffffffffffa8;
  size_t rx__length;
  rx__int local_48;
  rx_context *local_40;
  size_t local_38;
  
  if (context == (rx_context *)0x0) {
    __assert_fail("context != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x159c,
                  "void rx__int_assess_comparison(struct rx_context *, rx__int, rx__int, enum rx__op, const char *, const char *, const char *, int, enum rx_severity, const char *, ...)"
                 );
  }
  if (_op == 0) {
    __assert_fail("expr1 != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x159d,
                  "void rx__int_assess_comparison(struct rx_context *, rx__int, rx__int, enum rx__op, const char *, const char *, const char *, int, enum rx_severity, const char *, ...)"
                 );
  }
  if (expr1 == (char *)0x0) {
    __assert_fail("expr2 != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x159e,
                  "void rx__int_assess_comparison(struct rx_context *, rx__int, rx__int, enum rx__op, const char *, const char *, const char *, int, enum rx_severity, const char *, ...)"
                 );
  }
  uVar3 = (ulong)expr2 & 0xffffffff;
  bVar4 = x1 == x2;
  file_01 = (char *)(ulong)bVar4;
  local_48 = x2;
  if (bVar4) {
    s = (char *)0x0;
    pcVar2 = (char *)0x0;
    goto LAB_001035e9;
  }
  pcVar2 = (char *)0x0;
  local_40 = context;
  rVar1 = rx__str_initialize(&rx__length,(char *)0x0,"`%s` is expected to be %s `%s`",_op,"equal to"
                             ,expr1);
  if (rVar1 == RX_SUCCESS) {
    local_38 = rx__length;
    s = (char *)malloc(rx__length);
    if (s == (char *)0x0) {
      rx__log(RX_LOG_LEVEL_ALL,pcVar2,0x15ca,"failed to allocate the string (%lu bytes)\n",local_38)
      ;
      goto LAB_00103573;
    }
    pcVar2 = s;
    rVar1 = rx__str_initialize(&rx__length,s,"`%s` is expected to be %s `%s`",_op,"equal to",expr1);
    if (rVar1 != RX_SUCCESS) {
      free(s);
      goto LAB_00103573;
    }
  }
  else {
LAB_00103573:
    s = (char *)0x0;
    rx__log(RX_LOG_LEVEL_ALL,pcVar2,0x15d3,
            "failed to create the failure message for the integer comparison test located at %s:%d\n"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/mem.c"
            ,uVar3);
  }
  file_00 = (char *)0x0;
  rVar1 = rx__str_initialize(&rx__length,(char *)0x0,"%ld %s %ld",x1,"==",local_48);
  if (rVar1 == RX_SUCCESS) {
    pcVar2 = (char *)malloc(rx__length);
    if (pcVar2 == (char *)0x0) {
      rx__log(RX_LOG_LEVEL_ALL,file_00,0x15dd,"failed to allocate the string (%lu bytes)\n",
              rx__length);
    }
    else {
      file_00 = pcVar2;
      rVar1 = rx__str_initialize(&rx__length,pcVar2,"%ld %s %ld",x1,"==",local_48);
      context = local_40;
      if (rVar1 == RX_SUCCESS) goto LAB_001035e9;
      free(pcVar2);
    }
  }
  pcVar2 = (char *)0x0;
  rx__log(RX_LOG_LEVEL_ALL,file_00,0x15e2,
          "failed to create the diagnostic message for the integer comparison test located at %s:%d\n"
          ,
          "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/mem.c"
          ,uVar3);
  context = local_40;
LAB_001035e9:
  rVar1 = rx_handle_test_result
                    (context,(uint)bVar4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/mem.c"
                     ,(int)expr2,(rx_severity)s,pcVar2,in_stack_ffffffffffffffa8);
  if (rVar1 != RX_SUCCESS) {
    rx__log(RX_LOG_LEVEL_ALL,file_01,0x15ed,
            "failed to handle the test result for the integer comparison test located at %s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/tests/base/mem.c"
            ,uVar3);
  }
  free(s);
  free(pcVar2);
  if (x1 != local_48) {
    rx_abort(context);
  }
  return;
}

Assistant:

static void
rx__int_assess_comparison(struct rx_context *context,
                          rx__int x1,
                          rx__int x2,
                          enum rx__op op,
                          const char *expr1,
                          const char *expr2,
                          const char *file,
                          int line,
                          enum rx_severity severity,
                          const char *failure_fmt,
                          ...)
{
    int result;
    char *failure_msg;
    char *diagnostic_msg;

    RX_ASSERT(context != NULL);
    RX_ASSERT(expr1 != NULL);
    RX_ASSERT(expr2 != NULL);
    RX_ASSERT(file != NULL);

    switch (op) {
        case RX__OP_EQUAL:
            result = x1 == x2;
            break;
        case RX__OP_NOT_EQUAL:
            result = x1 != x2;
            break;
        case RX__OP_GREATER:
            result = x1 > x2;
            break;
        case RX__OP_LESSER:
            result = x1 < x2;
            break;
        case RX__OP_GREATER_OR_EQUAL:
            result = x1 >= x2;
            break;
        case RX__OP_LESSER_OR_EQUAL:
            result = x1 <= x2;
            break;
        default:
            RX_ASSERT(0);
            result = 0;
            break;
    }

    if (result) {
        failure_msg = NULL;
        diagnostic_msg = NULL;
    } else {
        enum rx_status status;
        const char *op_symbol;

        if (failure_fmt == NULL) {
            const char *op_name;

            rx__op_get_name(&op_name, op);
            RX__STR_CREATE_3(status,
                             failure_msg,
                             "`%s` is expected to be %s `%s`",
                             expr1,
                             op_name,
                             expr2);
        } else {
            RX__STR_CREATE_VA_LIST(status, failure_msg, failure_fmt);
        }

        if (status != RX_SUCCESS) {
            RX__LOG_DEBUG_2("failed to create the failure message for "
                            "the integer comparison test located at %s:%d\n",
                            file,
                            line);
            failure_msg = NULL;
        }

        rx__op_get_symbol(&op_symbol, op);
        RX__STR_CREATE_3(status,
                         diagnostic_msg,
                         "%ld %s %ld",
                         (long)x1,
                         op_symbol,
                         (long)x2);
        if (status != RX_SUCCESS) {
            RX__LOG_DEBUG_2("failed to create the diagnostic message for "
                            "the integer comparison test located at %s:%d\n",
                            file,
                            line);
            diagnostic_msg = NULL;
        }
    }

    if (rx_handle_test_result(
            context, result, file, line, severity, failure_msg, diagnostic_msg)
        != RX_SUCCESS) {
        RX__LOG_DEBUG_2("failed to handle the test result for the integer "
                        "comparison test located at %s:%d\n",
                        file,
                        line);
    }

    RX_FREE(failure_msg);
    RX_FREE(diagnostic_msg);

    if (!result && severity == RX_FATAL) {
        rx_abort(context);
    }
}